

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.cpp
# Opt level: O1

void __thiscall duckdb_re2::Regex::Regex(Regex *this,string *pattern,RegexOptions options)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  RE2 *pRVar1;
  undefined7 in_register_00000011;
  RE2 *__tmp;
  undefined1 local_51;
  RE2 *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  StringPiece local_40;
  Options local_30;
  
  (this->regex).internal.super___shared_ptr<duckdb_re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->regex).internal.super___shared_ptr<duckdb_re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30.max_mem_ = 0x800000;
  local_30.encoding_ = EncodingUTF8;
  local_30.posix_syntax_ = false;
  local_30.longest_match_ = false;
  local_30.log_errors_ = true;
  local_30._15_8_ = (ulong)((int)CONCAT71(in_register_00000011,options) == 1) << 0x20;
  local_40.data_ = (pattern->_M_dataplus)._M_p;
  local_40.size_ = pattern->_M_string_length;
  local_50 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb_re2::RE2,std::allocator<duckdb_re2::RE2>,duckdb_re2::StringPiece,duckdb_re2::RE2::Options&>
            (&local_48,&local_50,(allocator<duckdb_re2::RE2> *)&local_51,&local_40,&local_30);
  pRVar1 = local_50;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
    }
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  (this->regex).internal.super___shared_ptr<duckdb_re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pRVar1;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->regex).internal.super___shared_ptr<duckdb_re2::RE2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->regex).internal.super___shared_ptr<duckdb_re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

Regex::Regex(const std::string &pattern, RegexOptions options) {
	RE2::Options o;
	o.set_case_sensitive(options == RegexOptions::CASE_INSENSITIVE);
	regex = duckdb::make_shared_ptr<duckdb_re2::RE2>(StringPiece(pattern), o);
}